

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,double>
                 (size_t nrows,int *x,int ncat,double *buffer_prob,MissingAction missing_action,
                 CategSplit cat_split_type,Xoshiro256PP *rnd_generator,float *w)

{
  float *pfVar1;
  size_t sVar2;
  long lVar3;
  allocator_type local_61;
  double local_60;
  MissingAction local_54;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> buffer_cnt;
  
  pfVar1 = w;
  local_60 = (double)CONCAT44(local_60._4_4_,cat_split_type);
  local_50 = 0.0;
  local_54 = missing_action;
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_cnt,(long)(ncat + 1),&local_50,&local_61);
  for (sVar2 = 0; nrows != sVar2; sVar2 = sVar2 + 1) {
    lVar3 = (long)x[sVar2];
    if ((long)x[sVar2] < 0) {
      lVar3 = (long)ncat;
    }
    buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] =
         (double)pfVar1[sVar2] +
         buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
  }
  local_60 = calc_kurtosis_weighted_internal<float*restrict,double>
                       ((vector<double,_std::allocator<double>_> *)
                        &buffer_cnt.super__Vector_base<double,_std::allocator<double>_>,x,ncat,
                        buffer_prob,local_54,local_60._0_4_,rnd_generator,&w);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&buffer_cnt.super__Vector_base<double,_std::allocator<double>_>);
  return local_60;
}

Assistant:

double calc_kurtosis_weighted(size_t nrows, int x[], int ncat, double *restrict buffer_prob,
                              MissingAction missing_action, CategSplit cat_split_type,
                              RNG_engine &rnd_generator, real_t *restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = 0; row < nrows; row++)
    {
        w_this = w[row];
        if (likely(x[row] >= 0))
            buffer_cnt[x[row]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<real_t *restrict, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}